

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_reflection_class.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::ReflectionClassGenerator::WriteDescriptor
          (ReflectionClassGenerator *this,Printer *printer)

{
  string *psVar1;
  bool bVar2;
  Options *pOVar3;
  FileDescriptor *pFVar4;
  EnumDescriptor *this_00;
  FieldDescriptor *this_01;
  Descriptor *descriptor;
  FileDescriptor *descriptor_00;
  char *extraout_RDX;
  FileDescriptor *descriptor_01;
  EnumDescriptor *descriptor_02;
  char *pcVar5;
  FieldDescriptor *descriptor_03;
  int i_1;
  int i;
  int iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view filename;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view text_09;
  string_view text_10;
  string_view text_11;
  string_view text_12;
  string_view text_13;
  string_view text_14;
  string_view text_15;
  string_view text_16;
  string_view text_17;
  string_view separator;
  size_t sStackY_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string base64;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensions;
  
  psVar1 = this->file_->name_;
  base64._M_string_length = (size_type)(psVar1->_M_dataplus)._M_p;
  base64._M_dataplus._M_p = (pointer)psVar1->_M_string_length;
  text._M_str = 
  "#region Descriptor\n/// <summary>File descriptor for $file_name$</summary>\npublic static pbr::FileDescriptor Descriptor {\n  get { return descriptor; }\n}\nprivate static pbr::FileDescriptor descriptor;\n\nstatic $reflection_class_name$() {\n"
  ;
  text._M_len = 0xeb;
  io::Printer::
  Print<char[10],std::basic_string_view<char,std::char_traits<char>>,char[22],std::__cxx11::string>
            (printer,text,(char (*) [10])0x531a64,
             (basic_string_view<char,_std::char_traits<char>_> *)&base64,(char (*) [22])0x461bfa,
             &this->reflectionClassname_);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  text_00._M_str = "byte[] descriptorData = global::System.Convert.FromBase64String(\n";
  text_00._M_len = 0x41;
  io::Printer::Print<>(printer,text_00);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent * 2;
  text_01._M_str = "string.Concat(\n";
  text_01._M_len = 0xf;
  io::Printer::Print<>(printer,text_01);
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  pOVar3 = SourceGeneratorBase::options(&this->super_SourceGeneratorBase);
  if (pOVar3->strip_nonfunctional_codegen == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&base64,"",(allocator<char> *)&local_88);
  }
  else {
    FileDescriptorToBase64_abi_cxx11_(&base64,(csharp *)this->file_,descriptor_00);
  }
  while (0x3c < base64._M_string_length) {
    std::__cxx11::string::substr((ulong)&local_88,(ulong)&base64);
    text_02._M_str = "\"$base64$\",\n";
    text_02._M_len = 0xc;
    io::Printer::Print<char[7],std::__cxx11::string>
              (printer,text_02,(char (*) [7])"base64",&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::substr((ulong)&local_88,(ulong)&base64);
    std::__cxx11::string::operator=((string *)&base64,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
  }
  args_1 = &base64;
  text_03._M_str = "\"$base64$\"));\n";
  text_03._M_len = 0xe;
  io::Printer::Print<char[7],std::__cxx11::string>(printer,text_03,(char (*) [7])"base64",args_1);
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  text_04._M_str = "descriptor = pbr::FileDescriptor.FromGeneratedCode(descriptorData,\n";
  text_04._M_len = 0x43;
  io::Printer::Print<>(printer,text_04);
  text_05._M_str = "    new pbr::FileDescriptor[] { ";
  text_05._M_len = 0x20;
  io::Printer::Print<>(printer,text_05);
  iVar6 = 0;
  do {
    if (this->file_->dependency_count_ <= iVar6) {
      text_07._M_str = "},\n    new pbr::GeneratedClrTypeInfo(";
      text_07._M_len = 0x25;
      io::Printer::Print<>(printer,text_07);
      if (this->file_->enum_type_count_ < 1) {
        pcVar5 = "null, ";
        sStackY_a0 = 6;
      }
      else {
        text_08._M_str = "new[] {";
        text_08._M_len = 7;
        io::Printer::Print<>(printer,text_08);
        for (iVar6 = 0; iVar6 < this->file_->enum_type_count_; iVar6 = iVar6 + 1) {
          this_00 = FileDescriptor::enum_type(this->file_,iVar6);
          GetClassName_abi_cxx11_(&local_88,(csharp *)this_00,descriptor_02);
          text_09._M_str = "typeof($type_name$), ";
          text_09._M_len = 0x15;
          args_1 = &local_88;
          io::Printer::Print<char[10],std::__cxx11::string>
                    (printer,text_09,(char (*) [10])0x5cd508,&local_88);
          std::__cxx11::string::~string((string *)&local_88);
        }
        pcVar5 = "}, ";
        sStackY_a0 = 3;
      }
      text_10._M_str = pcVar5;
      text_10._M_len = sStackY_a0;
      io::Printer::Print<>(printer,text_10);
      if (this->file_->extension_count_ < 1) {
        text_12._M_str = "null, ";
        text_12._M_len = 6;
        io::Printer::Print<>(printer,text_12);
      }
      else {
        extensions.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        extensions.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        extensions.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reserve(&extensions,(long)this->file_->extension_count_);
        for (iVar6 = 0; iVar6 < this->file_->extension_count_; iVar6 = iVar6 + 1) {
          this_01 = FileDescriptor::extension(this->file_,iVar6);
          GetFullExtensionName_abi_cxx11_(&local_88,(csharp *)this_01,descriptor_03);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &extensions,&local_88);
          std::__cxx11::string::~string((string *)&local_88);
        }
        separator._M_str = (char *)args_1;
        separator._M_len = (size_t)", ";
        absl::lts_20250127::strings_internal::
        JoinRange<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_88,(strings_internal *)&extensions,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x2,separator);
        text_11._M_str = "new pb::Extension[] { $extensions$ }, ";
        text_11._M_len = 0x26;
        io::Printer::Print<char[11],std::__cxx11::string>
                  (printer,text_11,(char (*) [11])0x518fbe,&local_88);
        std::__cxx11::string::~string((string *)&local_88);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&extensions);
      }
      if (this->file_->message_type_count_ < 1) {
        text_15._M_str = "null));\n";
        text_15._M_len = 8;
        io::Printer::Print<>(printer,text_15);
      }
      else {
        text_13._M_str = "new pbr::GeneratedClrTypeInfo[] {\n";
        text_13._M_len = 0x22;
        io::Printer::Print<>(printer,text_13);
        printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent * 3;
        for (iVar6 = 0; iVar6 < this->file_->message_type_count_; iVar6 = iVar6 + 1) {
          descriptor = FileDescriptor::message_type(this->file_,iVar6);
          WriteGeneratedCodeInfo
                    (this,descriptor,printer,iVar6 == this->file_->message_type_count_ + -1);
        }
        io::Printer::Outdent(printer);
        text_14._M_str = "\n}));\n";
        text_14._M_len = 6;
        io::Printer::Print<>(printer,text_14);
        io::Printer::Outdent(printer);
        io::Printer::Outdent(printer);
      }
      io::Printer::Outdent(printer);
      text_16._M_str = "}\n";
      text_16._M_len = 2;
      io::Printer::Print<>(printer,text_16);
      text_17._M_str = "#endregion\n\n";
      text_17._M_len = 0xc;
      io::Printer::Print<>(printer,text_17);
      std::__cxx11::string::~string((string *)&base64);
      return;
    }
    pOVar3 = SourceGeneratorBase::options(&this->super_SourceGeneratorBase);
    if (pOVar3->strip_nonfunctional_codegen == true) {
      pFVar4 = FileDescriptor::dependency(this->file_,iVar6);
      filename._M_str = extraout_RDX;
      filename._M_len = (size_t)(pFVar4->name_->_M_dataplus)._M_p;
      bVar2 = IsKnownFeatureProto((compiler *)pFVar4->name_->_M_string_length,filename);
      if (!bVar2) goto LAB_0016f3ad;
    }
    else {
LAB_0016f3ad:
      pFVar4 = FileDescriptor::dependency(this->file_,iVar6);
      GetReflectionClassName_abi_cxx11_(&local_88,(csharp *)pFVar4,descriptor_01);
      text_06._M_str = "$full_reflection_class_name$.Descriptor, ";
      text_06._M_len = 0x29;
      args_1 = &local_88;
      io::Printer::Print<char[27],std::__cxx11::string>
                (printer,text_06,(char (*) [27])"full_reflection_class_name",&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

void ReflectionClassGenerator::WriteDescriptor(io::Printer* printer) {
  printer->Print(
    "#region Descriptor\n"
    "/// <summary>File descriptor for $file_name$</summary>\n"
    "public static pbr::FileDescriptor Descriptor {\n"
    "  get { return descriptor; }\n"
    "}\n"
    "private static pbr::FileDescriptor descriptor;\n"
    "\n"
    "static $reflection_class_name$() {\n",
    "file_name", file_->name(),
    "reflection_class_name", reflectionClassname_);
  printer->Indent();
  printer->Print(
    "byte[] descriptorData = global::System.Convert.FromBase64String(\n");
  printer->Indent();
  printer->Indent();
  printer->Print("string.Concat(\n");
  printer->Indent();

  // TODO: Consider a C#-escaping format here instead of just Base64.
  std::string base64 = options()->strip_nonfunctional_codegen
                           ? ""
                           : FileDescriptorToBase64(file_);
  while (base64.size() > 60) {
    printer->Print("\"$base64$\",\n", "base64", base64.substr(0, 60));
    base64 = base64.substr(60);
  }
  printer->Print("\"$base64$\"));\n", "base64", base64);
  printer->Outdent();
  printer->Outdent();
  printer->Outdent();

  // -----------------------------------------------------------------
  // Invoke InternalBuildGeneratedFileFrom() to build the file.
  printer->Print(
      "descriptor = pbr::FileDescriptor.FromGeneratedCode(descriptorData,\n");
  printer->Print("    new pbr::FileDescriptor[] { ");
  for (int i = 0; i < file_->dependency_count(); i++) {
    if (options()->strip_nonfunctional_codegen &&
        IsKnownFeatureProto(file_->dependency(i)->name())) {
      // Strip feature imports for editions codegen tests.
      continue;
    }
    printer->Print("$full_reflection_class_name$.Descriptor, ",
                   "full_reflection_class_name",
                   GetReflectionClassName(file_->dependency(i)));
  }
  printer->Print("},\n"
      "    new pbr::GeneratedClrTypeInfo(");
  // Specify all the generated code information, recursively.
  if (file_->enum_type_count() > 0) {
      printer->Print("new[] {");
      for (int i = 0; i < file_->enum_type_count(); i++) {
          printer->Print("typeof($type_name$), ", "type_name", GetClassName(file_->enum_type(i)));
      }
      printer->Print("}, ");
  }
  else {
      printer->Print("null, ");
  }  
  if (file_->extension_count() > 0) {
    std::vector<std::string> extensions;
    extensions.reserve(file_->extension_count());
    for (int i = 0; i < file_->extension_count(); i++) {
      extensions.push_back(GetFullExtensionName(file_->extension(i)));
    }
    printer->Print("new pb::Extension[] { $extensions$ }, ", "extensions", absl::StrJoin(extensions, ", "));
  }
  else {
    printer->Print("null, ");
  }
  if (file_->message_type_count() > 0) {
      printer->Print("new pbr::GeneratedClrTypeInfo[] {\n");
      printer->Indent();
      printer->Indent();
      printer->Indent();
      for (int i = 0; i < file_->message_type_count(); i++) {
          WriteGeneratedCodeInfo(file_->message_type(i), printer, i == file_->message_type_count() - 1);
      }
      printer->Outdent();
      printer->Print("\n}));\n");
      printer->Outdent();
      printer->Outdent();
  }
  else {
      printer->Print("null));\n");
  }

  printer->Outdent();
  printer->Print("}\n");
  printer->Print("#endregion\n\n");
}